

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gulcalc.cpp
# Opt level: O3

void __thiscall gulcalc::covoutputgul(gulcalc *this,gulcoverageSampleslevel *gg)

{
  OASIS_FLOAT OVar1;
  uchar *puVar2;
  int iVar3;
  int iVar4;
  
  if (this->coverageWriter_ != (_func_void_void_ptr_int_int *)0x0) {
    iVar4 = this->covbufoffset_;
    if (15999 < iVar4) {
      (*this->coverageWriter_)(this->cbuf_,1,iVar4);
      this->covbufoffset_ = 0;
      iVar4 = 0;
    }
    iVar3 = gg->event_id;
    if ((iVar3 != lastcoverageheader.event_id) || (gg->coverage_id != lastcoverageheader.item_id)) {
      if (this->isFirstCovEvent_ == false) {
        puVar2 = this->cbuf_ + iVar4;
        puVar2[0] = '\0';
        puVar2[1] = '\0';
        puVar2[2] = '\0';
        puVar2[3] = '\0';
        puVar2[4] = '\0';
        puVar2[5] = '\0';
        puVar2[6] = '\0';
        puVar2[7] = '\0';
        iVar4 = this->covbufoffset_ + 8;
        this->covbufoffset_ = iVar4;
        iVar3 = gg->event_id;
      }
      else {
        this->isFirstCovEvent_ = false;
      }
      lastcoverageheader.item_id = gg->coverage_id;
      lastcoverageheader.event_id = iVar3;
      *(ulong *)(this->cbuf_ + iVar4) = CONCAT44(lastcoverageheader.item_id,iVar3);
      iVar4 = this->covbufoffset_ + 8;
      this->covbufoffset_ = iVar4;
    }
    OVar1 = gg->loss;
    puVar2 = this->cbuf_;
    *(int *)(puVar2 + iVar4) = gg->sidx;
    *(OASIS_FLOAT *)(puVar2 + (long)iVar4 + 4) = OVar1;
    this->covbufoffset_ = this->covbufoffset_ + 8;
  }
  return;
}

Assistant:

void gulcalc::covoutputgul(gulcoverageSampleslevel &gg)
{
	if (coverageWriter_ == 0)  return;
	if (covbufoffset_ >= bufsize) {
		coverageWriter_(cbuf_,sizeof(unsigned char), covbufoffset_);
		covbufoffset_ = 0;
	}

	if (gg.event_id != lastcoverageheader.event_id || gg.coverage_id != lastcoverageheader.item_id) {
		if (isFirstCovEvent_ == false) {
			gulSampleslevelRec r;
			r.sidx = 0;
			r.loss = 0;
			memcpy(cbuf_ + covbufoffset_, &r, sizeof(gulSampleslevelRec));
			covbufoffset_ += sizeof(gulSampleslevelRec);	// null terminate list
		}
		else {
			isFirstCovEvent_ = false;
		}
		lastcoverageheader.event_id = gg.event_id;
		lastcoverageheader.item_id = gg.coverage_id;
		memcpy(cbuf_ + covbufoffset_, &lastcoverageheader, sizeof(lastcoverageheader));
		covbufoffset_ += sizeof(lastcoverageheader);
	}

	gulSampleslevelRec r;
	r.sidx = gg.sidx;
	r.loss = gg.loss;
	memcpy(cbuf_ + covbufoffset_, &r, sizeof(gulSampleslevelRec));
	covbufoffset_ += sizeof(gulSampleslevelRec);

}